

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O2

TreeNode *
si9ma::BinaryTree::restore_process_pre_order
          (queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *str)

{
  bool bVar1;
  int value;
  TreeNode *this;
  TreeNode *pTVar2;
  
  bVar1 = std::operator==("#",(str->c).
                              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur);
  if (bVar1) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&str->c);
    this = (TreeNode *)0x0;
  }
  else {
    this = (TreeNode *)operator_new(0x20);
    value = std::__cxx11::stoi((str->c).
                               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur,(size_t *)0x0,10);
    TreeNode::TreeNode(this,value);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&str->c);
    pTVar2 = restore_process_pre_order(str);
    this->left = pTVar2;
    pTVar2 = restore_process_pre_order(str);
    this->right = pTVar2;
  }
  return this;
}

Assistant:

TreeNode* BinaryTree::restore_process_pre_order(queue<string>& str) {
        if ("#" == str.front()){
            str.pop();
            return nullptr;
        }

        auto *head = new TreeNode(stoi(str.front()));
        str.pop();
        head->left = restore_process_pre_order(str);
        head->right = restore_process_pre_order(str);

        return head;
    }